

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_spin_flip.hpp
# Opt level: O1

void openjij::updater::
     SingleSpinFlip<openjij::system::ClassicalIsing<openjij::graph::Dense<double>>>::
     update<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
               (ClIsing *system,
               mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *random_number_engine,ClassicalUpdaterParameter *parameter)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  size_t sVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  ulong uVar11;
  Index index;
  ulong uVar12;
  long lVar13;
  long lVar14;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  double dVar15;
  double dVar16;
  
  Eigen::internal::manage_multi_threading(Eigen::Action,int*)::m_maxThreads = 1;
  if (Eigen::internal::manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes == '\0')
  {
    iVar10 = __cxa_guard_acquire(&Eigen::internal::
                                  manage_caching_sizes(Eigen::Action,long*,long*,long*)::
                                  m_cacheSizes);
    if (iVar10 != 0) {
      Eigen::internal::CacheSizes::CacheSizes
                ((CacheSizes *)
                 &Eigen::internal::manage_caching_sizes(Eigen::Action,long*,long*,long*)::
                  m_cacheSizes);
      __cxa_guard_release(&Eigen::internal::manage_caching_sizes(Eigen::Action,long*,long*,long*)::
                           m_cacheSizes);
    }
  }
  if (system->num_spins != 0) {
    lVar14 = 0;
    uVar11 = 0;
    do {
      if ((system->dE).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= (long)uVar11) goto LAB_00176abc;
      dVar15 = (system->dE).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
               .m_data[uVar11];
      if (dVar15 <= 0.0) {
LAB_0017696c:
        uVar12 = (system->spin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if ((long)uVar12 <= (long)uVar11) goto LAB_00176abc;
        pdVar2 = (system->spin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        pdVar3 = (system->interaction).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        dVar15 = pdVar2[uVar11] * 4.0;
        uVar4 = (system->interaction).
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
        if ((long)uVar4 < 0 && pdVar3 != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
                       );
        }
        if ((system->interaction).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
            m_storage.m_rows <= (long)uVar11) {
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                        "Eigen::Block<const Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
                       );
        }
        if (uVar4 != uVar12) {
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        if ((long)uVar12 < 0) {
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        uVar5 = (system->dE).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if (uVar5 != uVar12) {
          __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, const Eigen::Matrix<double, -1, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                       );
        }
        pdVar6 = (system->dE).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar12 = uVar5 - ((long)uVar5 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar5) {
          lVar13 = 0;
          do {
            pdVar1 = (double *)((long)pdVar3 + lVar13 * 8 + uVar4 * lVar14);
            dVar8 = pdVar1[1];
            dVar9 = (pdVar2 + lVar13)[1];
            dVar16 = (pdVar6 + lVar13)[1];
            pdVar6[lVar13] = pdVar2[lVar13] * *pdVar1 * dVar15 + pdVar6[lVar13];
            (pdVar6 + lVar13)[1] = dVar9 * dVar8 * dVar15 + dVar16;
            lVar13 = lVar13 + 2;
          } while (lVar13 < (long)uVar12);
        }
        if ((long)uVar12 < (long)uVar5) {
          do {
            pdVar6[uVar12] =
                 *(double *)((long)pdVar3 + uVar12 * 8 + uVar4 * lVar14) * pdVar2[uVar12] * dVar15 +
                 pdVar6[uVar12];
            uVar12 = uVar12 + 1;
          } while (uVar5 != uVar12);
        }
        if (((system->dE).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows <= (long)uVar11) ||
           (pdVar2 = (system->dE).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data, pdVar2[uVar11] = -pdVar2[uVar11],
           (system->spin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows <= (long)uVar11)) goto LAB_00176abc;
        pdVar2 = (system->spin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        pdVar2[uVar11] = -pdVar2[uVar11];
      }
      else {
        dVar15 = exp(dVar15 * -parameter->beta);
        dVar16 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           (random_number_engine);
        if (dVar16 < dVar15) goto LAB_0017696c;
      }
      sVar7 = system->num_spins;
      if (((long)sVar7 < 0) ||
         ((system->spin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= (long)sVar7)) {
LAB_00176abc:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      (system->spin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [sVar7] = 1.0;
      uVar11 = uVar11 + 1;
      lVar14 = lVar14 + 8;
    } while (uVar11 < system->num_spins);
  }
  return;
}

Assistant:

inline static void
  update(ClIsing &system, RandomNumberEngine &random_number_engine,
         const utility::ClassicalUpdaterParameter &parameter) {
    // set probability distribution object
    // to do Metroopolis
    auto urd = std::uniform_real_distribution<>(0, 1.0);

    Eigen::setNbThreads(1);
    Eigen::initParallel();

    // do a iteraction except for the auxiliary spin
    for (std::size_t index = 0; index < system.num_spins; ++index) {

      if (system.dE(index) <= 0 ||
          std::exp(-parameter.beta * system.dE(index)) >
              urd(random_number_engine)) {
        // update dE
        system.dE += 4 * system.spin(index) *
                     (system.interaction.row(index).transpose().cwiseProduct(
                         system.spin));

        system.dE(index) *= -1;
        system.spin(index) *= -1;
      }

      // assure that the dummy spin is not changed.
      system.spin(system.num_spins) = 1;
    }
  }